

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::ArrayJoinPromiseNodeBase::get(ArrayJoinPromiseNodeBase *this,ExceptionOrValue *output)

{
  Branch *pBVar1;
  size_t sVar2;
  long *plVar3;
  Branch *branch;
  Branch *pBVar4;
  long lVar5;
  
  pBVar1 = (this->branches).ptr;
  sVar2 = (this->branches).size_;
  pBVar4 = pBVar1;
  for (lVar5 = 0; sVar2 * 0x58 - lVar5 != 0; lVar5 = lVar5 + 0x58) {
    if (this->joinBehavior == LAZY) {
      plVar3 = *(long **)((long)&(pBVar1->dependency).ptr + lVar5);
      (**(code **)(*plVar3 + 0x18))(plVar3,*(undefined8 *)((long)&pBVar1->output + lVar5));
    }
    if ((pBVar4->output->exception).ptr.isSet == true) {
      ExceptionOrValue::addException(output,&(pBVar4->output->exception).ptr.field_1.value);
    }
    pBVar4 = pBVar4 + 1;
  }
  if ((output->exception).ptr.isSet != false) {
    return;
  }
  (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])(this,output);
  return;
}

Assistant:

void ArrayJoinPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  for (auto& branch: branches) {
    if (joinBehavior == ArrayJoinBehavior::LAZY) {
      // This implements `joinPromises()`'s lazy evaluation semantics.
      branch.dependency->get(branch.output);
    }

    // If any of the elements threw exceptions, propagate them.
    KJ_IF_SOME(exception, branch.output.exception) {
      output.addException(kj::mv(exception));
    }
  }

  // We either failed fast, or waited for all promises.
  KJ_DASSERT(countLeft == 0 || output.exception != kj::none);

  if (output.exception == kj::none) {
    // No errors.  The template subclass will need to fill in the result.
    getNoError(output);
  }
}